

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_from_range(uint64_t min,uint64_t max,uint32_t step)

{
  uint8_t typecode;
  roaring_array_t *ra;
  array_container_t *arr;
  uint min_00;
  uint uVar1;
  uint32_t max_00;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0x100000000;
  if (max < 0x100000000) {
    uVar2 = max;
  }
  if (min < uVar2 && step != 0) {
    ra = &roaring_bitmap_create_with_capacity(0)->high_low_container;
    if (step < 0x10000) {
      do {
        uVar1 = (uint)min;
        uVar3 = uVar2 - (uVar1 & 0xffff0000);
        if (0xffff < uVar3) {
          uVar3 = 0x10000;
        }
        min_00 = uVar1 & 0xffff;
        max_00 = (uint32_t)uVar3;
        if (step == 1) {
          if ((max_00 - min_00) + 1 < 3) {
            arr = array_container_create_range(min_00,max_00);
LAB_00101f1f:
            typecode = '\x02';
          }
          else {
            arr = (array_container_t *)run_container_create_given_capacity(1);
            typecode = '\x03';
            if (arr == (array_container_t *)0x0) {
              arr = (array_container_t *)0x0;
            }
            else {
              *(uint *)(arr->array + (long)arr->cardinality * 2) =
                   (~uVar1 + max_00) * 0x10000 | min_00;
              arr->cardinality = arr->cardinality + 1;
            }
          }
        }
        else {
          uVar1 = (~min_00 + step + max_00) / step;
          if (uVar1 < 0x1001) {
            arr = array_container_create_given_capacity(uVar1);
            array_container_add_from_range(arr,min_00,max_00,(uint16_t)step);
            goto LAB_00101f1f;
          }
          arr = (array_container_t *)bitset_container_create();
          bitset_container_add_from_range((bitset_container_t *)arr,min_00,max_00,(uint16_t)step);
          typecode = '\x01';
        }
        ra_append(ra,(uint16_t)(min >> 0x10),arr,typecode);
        uVar1 = ~min_00 + step + max_00;
        min = min + (uVar1 - uVar1 % step);
      } while (min < uVar2);
    }
    else {
      for (; min < max; min = (uint64_t)((uint32_t)min + step)) {
        roaring_bitmap_add((roaring_bitmap_t *)ra,(uint32_t)min);
      }
    }
  }
  else {
    ra = (roaring_array_t *)0x0;
  }
  return (roaring_bitmap_t *)ra;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_from_range(uint64_t min, uint64_t max,
                                            uint32_t step) {
    if (max >= UINT64_C(0x100000000)) {
        max = UINT64_C(0x100000000);
    }
    if (step == 0) return NULL;
    if (max <= min) return NULL;
    roaring_bitmap_t *answer = roaring_bitmap_create();
    if (step >= (1 << 16)) {
        for (uint32_t value = (uint32_t)min; value < max; value += step) {
            roaring_bitmap_add(answer, value);
        }
        return answer;
    }
    uint64_t min_tmp = min;
    do {
        uint32_t key = (uint32_t)min_tmp >> 16;
        uint32_t container_min = min_tmp & 0xFFFF;
        uint32_t container_max =
            (uint32_t)minimum_uint64(max - (key << 16), 1 << 16);
        uint8_t type;
        container_t *container = container_from_range(
            &type, container_min, container_max, (uint16_t)step);
        ra_append(&answer->high_low_container, (uint16_t)key, container, type);
        uint32_t gap = container_max - container_min + step - 1;
        min_tmp += gap - (gap % step);
    } while (min_tmp < max);
    // cardinality of bitmap will be ((uint64_t) max - min + step - 1 ) / step
    return answer;
}